

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

double opengv::absolute_pose::modules::gpnp_evaluate
                 (Matrix<double,_12,_1,_0,_12,_1> *solution,points_t *c,translation_t *t,
                 rotation_t *R)

{
  double *pdVar1;
  undefined8 *puVar2;
  double dVar3;
  pointer pMVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  undefined8 uVar9;
  ActualDstType actualDst;
  long lVar10;
  double dVar11;
  double dVar13;
  undefined1 auVar12 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  points_t ccam;
  transformation_t transformation;
  points_t local_e0;
  translation_t *local_c8;
  transformation_t local_c0;
  
  lVar10 = 0x10;
  local_e0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_e0.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_c8 = t;
  do {
    pdVar1 = (double *)
             ((long)(solution->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                    m_storage.m_data.array + lVar10 + -0x10);
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[0]
         = *pdVar1;
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[1]
         = pdVar1[1];
    local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.array[2]
         = *(double *)
            ((long)(solution->super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>).
                   m_storage.m_data.array + lVar10);
    if (local_e0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_e0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_e0,
                 (iterator)
                 local_e0.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 (Matrix<double,_3,_1,_0,_3,_1> *)&local_c0);
    }
    else {
      ((local_e0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[2];
      ((local_e0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[0];
      ((local_e0.
        super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
           local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
           array[1];
      local_e0.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_e0.
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x70);
  math::arun_complete(&local_c0,c,&local_e0);
  lVar10 = 0x10;
  (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0]
       = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[9];
  (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1]
       = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[10];
  (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
       = local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
         array[0xb];
  do {
    uVar9 = *(undefined8 *)((long)&local_c8 + lVar10);
    puVar2 = (undefined8 *)
             ((long)(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                    m_data.array + lVar10 + -0x10);
    *puVar2 = *(undefined8 *)
               ((long)&local_e0.
                       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + lVar10);
    puVar2[1] = uVar9;
    *(undefined8 *)
     ((long)(R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
     + lVar10) = *(undefined8 *)
                  ((long)local_c0.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.
                         m_storage.m_data.array + lVar10);
    lVar10 = lVar10 + 0x18;
  } while (lVar10 != 0x58);
  pMVar4 = (c->
           super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  dVar17 = 0.0;
  lVar10 = 0x10;
  auVar6 = vmovhpd_avx(*(undefined1 (*) [16])
                        ((R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage
                         .m_data.array + 2),
                       (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                       m_data.array[5]);
  do {
    auVar16 = vsubpd_avx(*(undefined1 (*) [16])
                          ((long)&(pMVar4->
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                                  m_storage.m_data + lVar10 + -0x10),
                         *(undefined1 (*) [16])
                          (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array);
    dVar15 = *(double *)
              ((long)&(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                      m_storage.m_data + lVar10) -
             (local_c8->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array[2];
    dVar11 = auVar16._0_8_;
    dVar13 = auVar16._8_8_;
    pdVar1 = (double *)
             ((long)((local_e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                    array + lVar10 + -0x10);
    dVar7 = *pdVar1;
    dVar8 = pdVar1[1];
    dVar5 = dVar15 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[8] +
            dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[6] +
            dVar13 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                     m_data.array[7];
    dVar3 = *(double *)
             ((long)((local_e0.
                      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
                    array + lVar10);
    dVar14 = dVar15 * auVar6._0_8_ +
             dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[0] +
             dVar13 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[1];
    dVar15 = dVar15 * auVar6._8_8_ +
             dVar11 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[3] +
             dVar13 * (R->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
                      m_data.array[4];
    lVar10 = lVar10 + 0x18;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar3 * dVar3 + dVar7 * dVar7 + dVar8 * dVar8;
    auVar16 = vsqrtsd_avx(auVar16,auVar16);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = dVar5 * dVar5 + dVar14 * dVar14 + dVar15 * dVar15;
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    dVar17 = dVar17 + (1.0 - (dVar5 * dVar3 + dVar14 * dVar7 + dVar15 * dVar8) /
                             (auVar16._0_8_ * auVar12._0_8_));
  } while (lVar10 != 0x70);
  free((void *)local_e0.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[-1].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2]);
  return dVar17;
}

Assistant:

double
opengv::absolute_pose::modules::gpnp_evaluate(
    const Eigen::Matrix<double,12,1> & solution,
    const points_t & c,
    translation_t & t,
    rotation_t & R )
{
  points_t ccam;
  for(size_t i = 0; i<4; i++)
    ccam.push_back(solution.block<3,1>(i*3,0));

  transformation_t transformation = math::arun_complete(c,ccam);
  t = transformation.col(3);
  R = transformation.block<3,3>(0,0);

  //transform world points into camera frame and compute the error
  double error = 0.0;
  for(size_t i = 0; i<4; i++)
  {
    point_t ccam_reprojected = R.transpose() * (c[i] - t);
    error +=
        1.0 -
        (ccam_reprojected.dot(ccam[i])/(ccam[i].norm()*ccam_reprojected.norm()));
  }

  return error;
}